

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

bool __thiscall cfd::core::Psbt::IsFindTxInRecord(Psbt *this,uint32_t index,ByteData *key)

{
  undefined4 in_register_00000034;
  bool is_find;
  bool local_31;
  ByteData local_30;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0xb02,"IsFindTxInRecord");
  local_31 = false;
  GetPsbtInput(&local_30,key,
               (wally_psbt_input *)
               ((ulong)index * 0x110 + *(long *)((long)this->wally_psbt_pointer_ + 0x10)),&local_31)
  ;
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_31;
}

Assistant:

bool Psbt::IsFindTxInRecord(uint32_t index, const ByteData &key) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  bool is_find = false;
  GetPsbtInput(key, &psbt_pointer->inputs[index], &is_find);
  return is_find;
}